

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_const_array(Context *ctx,ConstantsList *clist,int base,int size)

{
  int iVar1;
  char *pcVar2;
  int leavedecimal;
  char *pcVar3;
  int iVar4;
  char val1 [32];
  char val0 [32];
  char val3 [32];
  char val2 [32];
  char varname [64];
  
  snprintf(varname,0x40,"const_array_%d_%d",base,(ulong)(uint)size);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  pcVar3 = (char *)(ulong)(uint)size;
  output_line(ctx,"const float4 %s[%d] = {",varname);
  ctx->indent = ctx->indent + 1;
  iVar1 = size;
  if (size < 1) {
    iVar1 = 0;
  }
  iVar4 = 0;
  while( true ) {
    leavedecimal = (int)pcVar3;
    if (iVar4 == iVar1) {
      ctx->indent = ctx->indent + -1;
      output_line(ctx,"};");
      output_line(ctx,"(void) %s[0];",varname);
      pop_output(ctx);
      return;
    }
    for (; (clist->constant).type != MOJOSHADER_UNIFORM_FLOAT; clist = clist->next) {
    }
    if ((clist->constant).index != base + iVar4) break;
    floatstr(ctx,val0,1,(clist->constant).value.f[0],leavedecimal);
    floatstr(ctx,val1,1,(clist->constant).value.f[1],leavedecimal);
    floatstr(ctx,val2,1,(clist->constant).value.f[2],leavedecimal);
    floatstr(ctx,val3,1,(clist->constant).value.f[3],leavedecimal);
    pcVar2 = "\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n";
    if (iVar4 < size + -1) {
      pcVar2 = "texture%s<float> %s_texture [[texture(%d)]],";
    }
    pcVar3 = val1;
    output_line(ctx,"float4(%s, %s, %s, %s)%s",val0,pcVar3,val2,val3,pcVar2 + 0x2b);
    clist = clist->next;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("clist->constant.index == (base + i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x126e,"void emit_METAL_const_array(Context *, const ConstantsList *, int, int)");
}

Assistant:

static void emit_METAL_const_array(Context *ctx, const ConstantsList *clist,
                                   int base, int size)
{
    char varname[64];
    get_METAL_const_array_varname_in_buf(ctx,base,size,varname,sizeof(varname));

    const char *cstr = NULL;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const float4 %s[%d] = {", varname, size);
    ctx->indent++;

    int i;
    for (i = 0; i < size; i++)
    {
        while (clist->constant.type != MOJOSHADER_UNIFORM_FLOAT)
            clist = clist->next;
        assert(clist->constant.index == (base + i));

        char val0[32];
        char val1[32];
        char val2[32];
        char val3[32];
        floatstr(ctx, val0, sizeof (val0), clist->constant.value.f[0], 1);
        floatstr(ctx, val1, sizeof (val1), clist->constant.value.f[1], 1);
        floatstr(ctx, val2, sizeof (val2), clist->constant.value.f[2], 1);
        floatstr(ctx, val3, sizeof (val3), clist->constant.value.f[3], 1);

        output_line(ctx, "float4(%s, %s, %s, %s)%s", val0, val1, val2, val3,
                        (i < (size-1)) ? "," : "");

        clist = clist->next;
    } // for

    ctx->indent--;
    output_line(ctx, "};");
    output_line(ctx, "(void) %s[0];", varname);  // stop compiler warnings.
    pop_output(ctx);
}